

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.c
# Opt level: O1

TCGArg do_constant_folding_cond(TCGContext_conflict9 *s,TCGOpcode op,TCGArg x,TCGArg y,TCGCond c)

{
  byte *pbVar1;
  uint64_t y_00;
  TCGTemp *ts1;
  TCGTemp *ts1_00;
  TCGTemp *ts2;
  TCGTemp *ts2_00;
  char *pcVar2;
  char *pcVar3;
  bool bVar4;
  _Bool _Var5;
  TCGCond c_00;
  TCGArg unaff_RBP;
  TCGArg TVar6;
  undefined4 in_register_00000034;
  undefined8 *puVar7;
  ulong y_01;
  uint uVar8;
  undefined8 *x_00;
  uint uVar9;
  
  puVar7 = (undefined8 *)CONCAT44(in_register_00000034,op);
  pbVar1 = *(byte **)(y + 0x30);
  y_00 = *(uint64_t *)(pbVar1 + 0x18);
  if ((**(char **)(x + 0x30) != '\x01') || (*pbVar1 != 1)) {
    _Var5 = ts_are_copies((TCGTemp *)x,(TCGTemp *)y);
    if (!_Var5) {
      if ((y_00 == 0 & *pbVar1) != 1) {
        return 2;
      }
      if (c == TCG_COND_LTU) {
        return 0;
      }
      return (ulong)(c != TCG_COND_GEU) + 1;
    }
    bVar4 = do_constant_folding_cond_eq(c);
    goto LAB_00d545a8;
  }
  x_00 = *(undefined8 **)(*(char **)(x + 0x30) + 0x18);
  if ((s->tcg_op_defs[op].flags & 0x10) != 0) {
    bVar4 = do_constant_folding_cond_64((uint64_t)x_00,y_00,c);
    goto LAB_00d545a8;
  }
  uVar8 = (uint)x_00;
  uVar9 = (uint)y_00;
  switch(c) {
  case TCG_COND_LT:
    bVar4 = (int)uVar8 < (int)uVar9;
    break;
  case TCG_COND_GE:
    bVar4 = (int)uVar9 <= (int)uVar8;
    break;
  case TCG_COND_LTU:
    bVar4 = uVar8 < uVar9;
    break;
  case TCG_COND_GEU:
    bVar4 = uVar9 <= uVar8;
    break;
  default:
    do_constant_folding_cond_cold_1();
    ts1 = (TCGTemp *)*x_00;
    ts1_00 = (TCGTemp *)x_00[1];
    ts2 = (TCGTemp *)*puVar7;
    ts2_00 = (TCGTemp *)puVar7[1];
    pcVar2 = (char *)ts2->state_ptr;
    if ((*pcVar2 != '\x01') || (pcVar3 = (char *)ts2_00->state_ptr, *pcVar3 != '\x01'))
    goto LAB_00d54688;
    y_01 = *(long *)(pcVar3 + 0x18) << 0x20 | (ulong)*(uint *)(pcVar2 + 0x18);
    pcVar2 = (char *)ts1->state_ptr;
    if ((*pcVar2 == '\x01') && (pcVar3 = (char *)ts1_00->state_ptr, *pcVar3 == '\x01')) {
      _Var5 = do_constant_folding_cond_64
                        (*(long *)(pcVar3 + 0x18) << 0x20 | (ulong)*(uint *)(pcVar2 + 0x18),y_01,
                         c_00);
      unaff_RBP = (TCGArg)_Var5;
LAB_00d54682:
      bVar4 = false;
    }
    else {
      if (y_01 == 0) {
        if (c_00 == TCG_COND_LTU) {
          unaff_RBP = 0;
        }
        else {
          if (c_00 != TCG_COND_GEU) goto LAB_00d5466b;
          unaff_RBP = 1;
        }
        goto LAB_00d54682;
      }
LAB_00d5466b:
      bVar4 = true;
    }
    if (!bVar4) {
      return unaff_RBP;
    }
LAB_00d54688:
    _Var5 = ts_are_copies(ts1,ts2);
    TVar6 = 2;
    if ((_Var5) && (_Var5 = ts_are_copies(ts1_00,ts2_00), _Var5)) {
      _Var5 = do_constant_folding_cond_eq(c_00);
      TVar6 = (TCGArg)_Var5;
    }
    return TVar6;
  case TCG_COND_EQ:
    bVar4 = uVar8 == uVar9;
    break;
  case TCG_COND_NE:
    bVar4 = uVar8 != uVar9;
    break;
  case TCG_COND_LE:
    bVar4 = (int)uVar8 <= (int)uVar9;
    break;
  case TCG_COND_GT:
    bVar4 = (int)uVar9 < (int)uVar8;
    break;
  case TCG_COND_LEU:
    bVar4 = uVar8 <= uVar9;
    break;
  case TCG_COND_GTU:
    bVar4 = uVar9 < uVar8;
  }
LAB_00d545a8:
  return (ulong)bVar4;
}

Assistant:

static TCGArg do_constant_folding_cond(TCGContext *s, TCGOpcode op, TCGArg x,
                                       TCGArg y, TCGCond c)
{
    tcg_target_ulong xv = arg_info(x)->val;
    tcg_target_ulong yv = arg_info(y)->val;
    if (arg_is_const(x) && arg_is_const(y)) {
        const TCGOpDef *def = &s->tcg_op_defs[op];
        tcg_debug_assert(!(def->flags & TCG_OPF_VECTOR));
        if (def->flags & TCG_OPF_64BIT) {
            return do_constant_folding_cond_64(xv, yv, c);
        } else {
            return do_constant_folding_cond_32(xv, yv, c);
        }
    } else if (args_are_copies(x, y)) {
        return do_constant_folding_cond_eq(c);
    } else if (arg_is_const(y) && yv == 0) {
        switch (c) {
        case TCG_COND_LTU:
            return 0;
        case TCG_COND_GEU:
            return 1;
        default:
            return 2;
        }
    }
    return 2;
}